

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O1

bool ImGui::TreeNodeCbxLinkHelp
               (char *label,int nCol,dataRefsLT idxCbx,char *cbxPopup,char *linkLabel,char *linkURL,
               char *linkPopup,char *helpURL,char *helpPopup,char *filter,int nOpCl,
               ImGuiTreeNodeFlags flags)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ImU32 col;
  ImVec4 *col_00;
  size_t sVar4;
  string local_50;
  
  if ((filter != (char *)0x0) && (*filter != '\0')) {
    return true;
  }
  iVar3 = TableGetColumnIndex();
  if (0 < iVar3) {
    TableNextRow(0,0.0);
  }
  col = GetColorU32(0x15,0.4);
  PushStyleColor(0x2d,col);
  col_00 = GetStyleColorVec4(0x2d);
  PushStyleColor(0x2e,col_00);
  PushID(label);
  if (nOpCl != 0) {
    SetNextItemOpen(0 < nOpCl,0);
  }
  bVar1 = TreeNodeEx(label,flags);
  TableNextCell();
  if ((int)idxCbx < 0x6f) {
    CheckboxDr("##CheckboxDr",idxCbx,cbxPopup);
    SameLine(0.0,-1.0);
  }
  if (linkURL == (char *)0x0 || linkLabel == (char *)0x0) {
    if (linkLabel == (char *)0x0 || linkURL != (char *)0x0) goto LAB_00182160;
    TextUnformatted(linkLabel,(char *)0x0);
    if ((linkPopup != (char *)0x0) && (bVar2 = IsItemHovered(0), bVar2)) {
      SetTooltip("%s",linkPopup);
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)0x0;
    ButtonURL(linkLabel,linkURL,linkPopup,false,0x10101,0x10101,(ImVec2 *)&local_50);
  }
  SameLine(0.0,-1.0);
LAB_00182160:
  if (helpURL != (char *)0x0) {
    iVar3 = TableGetColumnIndex();
    if (iVar3 < nCol + -1) {
      TableSetColumnIndex(nCol + -1);
    }
    bVar2 = ButtonIcon(anon_var_dwarf_26419c,helpPopup,true);
    if (bVar2) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar4 = strlen(helpURL);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,helpURL,helpURL + sVar4);
      LTOpenHelp(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  PopID();
  TableNextRow(0,0.0);
  PopStyleColor(2);
  return bVar1;
}

Assistant:

IMGUI_API bool TreeNodeCbxLinkHelp(const char* label, int nCol,
                                   dataRefsLT idxCbx, const char* cbxPopup,
                                   const char* linkLabel, const char* linkURL, const char* linkPopup,
                                   const char* helpURL, const char* helpPopup,
                                   const char* filter, int nOpCl,
                                   ImGuiTreeNodeFlags flags)
{
    if (filter && *filter) return true;                     // is a filter defined? Then we don't show tree nodes
    
    if (TableGetColumnIndex() > 0)                          // make sure we start on a row's beginning
        TableNextRow();

    // Set special background color for tree nodes
    ImGui::PushStyleColor(ImGuiCol_TableRowBg, ImGui::GetColorU32(ImGuiCol_Button, 0.4f));
    ImGui::PushStyleColor(ImGuiCol_TableRowBgAlt, ImGui::GetStyleColorVec4(ImGuiCol_TableRowBg));

    // makes sure that all buttons here are recongized as different
    PushID(label);
    
    // Tree node
    if (nOpCl)                                              // if requested...
        SetNextItemOpen(nOpCl > 0);                         // ...force open/close
    const bool b = TreeNodeEx(label, flags);                // draw tree node
    
    // add a checkbox
    TableNextCell();
    if (idxCbx < CNT_DATAREFS_LT) {
        CheckboxDr("##CheckboxDr", idxCbx, cbxPopup);
        SameLine();
    }
    
    // add a button with a link action to the 2nd cell
    if (linkLabel && linkURL) {
        ButtonURL(linkLabel, linkURL, linkPopup);
        SameLine();
    }
    // Not a button, but mayby just plain text?
    else if (linkLabel && !linkURL) {
        TextUnformatted(linkLabel);
        if (linkPopup && IsItemHovered())
            SetTooltip("%s", linkPopup);
        SameLine();
    }
    
    // add a help icon button
    if (helpURL) {
        if (TableGetColumnIndex() < nCol-1)                 // move to last column
            TableSetColumnIndex(nCol-1);
        if (ButtonIcon(ICON_FA_QUESTION_CIRCLE, helpPopup, true))
            LTOpenHelp(helpURL);                            // Help button handling
    }
    
    PopID();
    TableNextRow();                                         // move to next row
    ImGui::PopStyleColor(2);                                // Restore row color

    return b;
}